

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

void __thiscall
ON_SubD_FixedSizeHeap::Internal_HashAddPair
          (ON_SubD_FixedSizeHeap *this,uint hash,ON_SubDComponentPtr component0,
          ON_SubDVertex *vertex1)

{
  ON_SubD_FixedSizeHeap_ComponentPairHashElement *pOVar1;
  uint uVar2;
  ON_SubD_FixedSizeHeap_ComponentPairHashElement **ppOVar3;
  ON_SubDComponentPtr OVar4;
  
  if ((this->m_h_count != 0xffffffff) && (this->m_h_capacity != 0)) {
    uVar2 = (vertex1->super_ON_SubDComponentBase).m_id;
    if (uVar2 != this->m_v_index) {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_heap.cpp"
                 ,0x18c,"","unexpected has table state");
      return;
    }
    pOVar1 = this->m_hash_elements + (uVar2 - 1);
    (pOVar1->m_pair).m_pair[0].m_ptr = component0.m_ptr;
    OVar4 = ON_SubDComponentPtr::Create(vertex1);
    (pOVar1->m_pair).m_pair[1].m_ptr = OVar4.m_ptr;
    ppOVar3 = this->m_hash_table;
    pOVar1->m_next = ppOVar3[hash];
    ppOVar3[hash] = pOVar1;
    this->m_h_count = this->m_h_count + 1;
  }
  return;
}

Assistant:

bool ON_SubD_FixedSizeHeap::Internal_HashEnabled() const
{
  return (ON_SubD_FixedSizeHeap::DisabledHashCount != m_h_count && m_h_capacity > 0);
}